

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

void __thiscall ON_4dPoint::Transform(ON_4dPoint *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = this->x;
  dVar2 = this->y;
  dVar3 = this->z;
  dVar4 = this->w;
  dVar5 = xform->m_xform[1][1];
  dVar6 = xform->m_xform[1][0];
  dVar7 = xform->m_xform[1][2];
  dVar8 = xform->m_xform[1][3];
  dVar9 = xform->m_xform[2][1];
  dVar10 = xform->m_xform[2][0];
  dVar11 = xform->m_xform[2][2];
  dVar12 = xform->m_xform[2][3];
  dVar13 = xform->m_xform[3][1];
  dVar14 = xform->m_xform[3][0];
  dVar15 = xform->m_xform[3][2];
  dVar16 = xform->m_xform[3][3];
  this->x = xform->m_xform[0][3] * dVar4 +
            xform->m_xform[0][2] * dVar3 +
            xform->m_xform[0][0] * dVar1 + xform->m_xform[0][1] * dVar2;
  this->y = dVar8 * dVar4 + dVar7 * dVar3 + dVar6 * dVar1 + dVar5 * dVar2;
  this->z = dVar12 * dVar4 + dVar11 * dVar3 + dVar10 * dVar1 + dVar9 * dVar2;
  this->w = dVar4 * dVar16 + dVar3 * dVar15 + dVar1 * dVar14 + dVar2 * dVar13;
  return;
}

Assistant:

void ON_4dPoint::Transform( const ON_Xform& xform )
{
  double xx,yy,zz,ww;
  xx = xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][2]*z + xform.m_xform[0][3]*w;
  yy = xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][2]*z + xform.m_xform[1][3]*w;
  zz = xform.m_xform[2][0]*x + xform.m_xform[2][1]*y + xform.m_xform[2][2]*z + xform.m_xform[2][3]*w;
  ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3]*w;
  x = xx;
  y = yy;
  z = zz;
  w = ww;
}